

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1corr.c
# Opt level: O3

void test_1to1000(void)

{
  void *pvVar1;
  void *pvVar2;
  long i;
  uintptr_t uVar3;
  void *pvVar4;
  
  uVar3 = 0;
  pvVar1 = (*hm_new)();
  do {
    (*hm_insert)(pvVar1,uVar3,(void *)uVar3,0);
    uVar3 = uVar3 + 1;
  } while (uVar3 != 1000);
  pvVar4 = (void *)0x0;
  do {
    pvVar2 = (*hm_get)(pvVar1,(uintptr_t)pvVar4);
    if (pvVar2 != pvVar4) {
      pvVar1 = (*hm_get)(pvVar1,(uintptr_t)pvVar4);
      printf(anon_var_dwarf_29b,"hm_get(c, i)",pvVar1,"(void*)i",pvVar4,0x2d);
      bad = 1;
      exit(1);
    }
    pvVar4 = (void *)((long)pvVar4 + 1);
  } while (pvVar4 != (void *)0x3e8);
  (*hm_delete)(pvVar1);
  return;
}

Assistant:

static void test_1to1000()
{
    void *c = hm_new();
    for (long i=0; i<1000; i++)
        hm_insert(c, i, (void*)i, 0);
    for (long i=0; i<1000; i++)
        CHECK(hm_get(c, i), (void*)i);
    hm_delete(c);
}